

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoneyTest.cpp
# Opt level: O0

void __thiscall OrderMoneyTest::OrderMoneyTest(OrderMoneyTest *this)

{
  char local_21c [4];
  shared_ptr<RealMoney> local_218;
  char local_204 [4];
  shared_ptr<RealMoney> local_200;
  undefined4 local_1ec;
  shared_ptr<Bank> local_1e8;
  shared_ptr<OrderMoney> local_1d8;
  shared_ptr<MoneyText> local_1c8;
  shared_ptr<MoneyText> local_1b8;
  shared_ptr<oout::NamedTest> local_1a8;
  char local_194 [4];
  shared_ptr<RealMoney> local_190;
  char local_17c [4];
  shared_ptr<RealMoney> local_178;
  char local_164 [4];
  shared_ptr<RealMoney> local_160;
  shared_ptr<OrderMoney> local_150;
  shared_ptr<MoneyText> local_140;
  shared_ptr<MoneyText> local_130;
  shared_ptr<oout::NamedTest> local_120;
  char local_10c [4];
  shared_ptr<RealMoney> local_108;
  shared_ptr<OrderMoney> local_f8;
  shared_ptr<MoneyText> local_e8;
  shared_ptr<MoneyText> local_d8;
  shared_ptr<oout::NamedTest> local_c8;
  char local_b4 [4];
  shared_ptr<RealMoney> local_b0;
  char local_9c [4];
  shared_ptr<RealMoney> local_98;
  shared_ptr<OrderMoney> local_88;
  shared_ptr<MoneyText> local_78;
  shared_ptr<MoneyText> local_68;
  shared_ptr<oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  OrderMoneyTest *local_10;
  OrderMoneyTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"OrderMoney tests",&local_31);
  local_9c[0] = '\x05';
  local_9c[1] = '\0';
  local_9c[2] = '\0';
  local_9c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_98,&local_9c);
  local_b4[0] = '\a';
  local_b4[1] = '\0';
  local_b4[2] = '\0';
  local_b4[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_b0,&local_b4);
  std::make_shared<OrderMoney,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            ((shared_ptr<RealMoney> *)&local_88,&local_98);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>((shared_ptr<OrderMoney> *)&local_78);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_68,(char (*) [7])&local_78);
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])local_58,(shared_ptr<oout::EqualTest> *)"OrderMoney is sum of all items"
            );
  local_10c[0] = '*';
  local_10c[1] = '\0';
  local_10c[2] = '\0';
  local_10c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_108,&local_10c);
  std::make_shared<OrderMoney,std::shared_ptr<RealMoney>>((shared_ptr<RealMoney> *)&local_f8);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>((shared_ptr<OrderMoney> *)&local_e8);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_d8,(char (*) [7])&local_e8);
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])&local_c8,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is sum of one items");
  local_164[0] = '\x01';
  local_164[1] = '\0';
  local_164[2] = '\0';
  local_164[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_160,&local_164);
  local_17c[0] = '\x02';
  local_17c[1] = '\0';
  local_17c[2] = '\0';
  local_17c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_178,&local_17c);
  local_194[0] = '\x04';
  local_194[1] = '\0';
  local_194[2] = '\0';
  local_194[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_190,&local_194);
  std::
  make_shared<OrderMoney,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            ((shared_ptr<RealMoney> *)&local_150,&local_160,&local_178);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>((shared_ptr<OrderMoney> *)&local_140);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[6]>
            (&local_130,(char (*) [6])&local_140);
  std::make_shared<oout::NamedTest,char_const(&)[33],std::shared_ptr<oout::EqualTest>>
            ((char (*) [33])&local_120,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is sum of three items");
  local_1ec = 2;
  std::make_shared<Bank,char_const(&)[4],char_const(&)[4],int>
            ((char (*) [4])&local_1e8,(char (*) [4])"CHF",(int *)0x15401a);
  local_204[0] = '\x05';
  local_204[1] = '\0';
  local_204[2] = '\0';
  local_204[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_200,&local_204);
  local_21c[0] = '\n';
  local_21c[1] = '\0';
  local_21c[2] = '\0';
  local_21c[3] = '\0';
  std::make_shared<RealMoney,int,char_const(&)[4]>((int *)&local_218,&local_21c);
  std::
  make_shared<OrderMoney,char_const(&)[4],std::shared_ptr<Bank>,std::shared_ptr<RealMoney>,std::shared_ptr<RealMoney>>
            ((char (*) [4])&local_1d8,(shared_ptr<Bank> *)0x15401a,
             (shared_ptr<RealMoney> *)&local_1e8,&local_200);
  std::make_shared<MoneyText,std::shared_ptr<OrderMoney>>((shared_ptr<OrderMoney> *)&local_1c8);
  std::make_shared<oout::EqualTest,std::shared_ptr<MoneyText>,char_const(&)[7]>
            (&local_1b8,(char (*) [7])&local_1c8);
  std::make_shared<oout::NamedTest,char_const(&)[40],std::shared_ptr<oout::EqualTest>>
            ((char (*) [40])&local_1a8,
             (shared_ptr<oout::EqualTest> *)"OrderMoney is unify all money over Bank");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_30,local_58,&local_c8,&local_120,&local_1a8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_1a8);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_1b8);
  std::shared_ptr<MoneyText>::~shared_ptr(&local_1c8);
  std::shared_ptr<OrderMoney>::~shared_ptr(&local_1d8);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_218);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_200);
  std::shared_ptr<Bank>::~shared_ptr(&local_1e8);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_120);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_130);
  std::shared_ptr<MoneyText>::~shared_ptr(&local_140);
  std::shared_ptr<OrderMoney>::~shared_ptr(&local_150);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_190);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_178);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_160);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_c8);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_d8);
  std::shared_ptr<MoneyText>::~shared_ptr(&local_e8);
  std::shared_ptr<OrderMoney>::~shared_ptr(&local_f8);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_108);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_68);
  std::shared_ptr<MoneyText>::~shared_ptr(&local_78);
  std::shared_ptr<OrderMoney>::~shared_ptr(&local_88);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_b0);
  std::shared_ptr<RealMoney>::~shared_ptr(&local_98);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__OrderMoneyTest_00168260;
  return;
}

Assistant:

OrderMoneyTest::OrderMoneyTest()
: dirty::Test(
	"OrderMoney tests",
	make_shared<NamedTest>(
		"OrderMoney is sum of all items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(7, "USD")
				)
			),
			"12 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of one items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(42, "USD")
				)
			),
			"42 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is sum of three items",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					make_shared<RealMoney>(1, "USD"),
					make_shared<RealMoney>(2, "USD"),
					make_shared<RealMoney>(4, "USD")
				)
			),
			"7 USD"
		)
	),
	make_shared<NamedTest>(
		"OrderMoney is unify all money over Bank",
		make_shared<EqualTest>(
			make_shared<MoneyText>(
				make_shared<OrderMoney>(
					"USD",
					make_shared<Bank>("CHF", "USD", 2),
					make_shared<RealMoney>(5, "USD"),
					make_shared<RealMoney>(10, "CHF")
				)
			),
			"10 USD"
		)
	)
)
{
}